

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plist.c
# Opt level: O1

PList * p_list_remove(PList *list,pconstpointer data)

{
  PList *pPVar1;
  PList *pPVar2;
  PList *mem;
  
  if (list == (PList *)0x0) {
    pPVar2 = (PList *)0x0;
  }
  else {
    mem = list;
    if (list->data == data) {
      pPVar1 = (PList *)0x0;
    }
    else {
      do {
        pPVar1 = mem;
        mem = pPVar1->next;
        if (mem == (PList *)0x0) {
          return list;
        }
      } while (mem->data != data);
    }
    pPVar2 = mem->next;
    if (pPVar1 != (PList *)0x0) {
      pPVar1->next = pPVar2;
      pPVar2 = list;
    }
    p_free(mem);
  }
  return pPVar2;
}

Assistant:

P_LIB_API PList *
p_list_remove (PList		*list,
	       pconstpointer	data)
{
	PList *cur;
	PList *prev;
	PList *head;

	if (P_UNLIKELY (list == NULL))
		return NULL;

	for (head = list, prev = NULL, cur = list; cur != NULL;  prev = cur, cur = cur->next) {
		if (cur->data == data) {
			if (prev == NULL)
				head = cur->next;
			else
				prev->next = cur->next;

			p_free (cur);

			break;
		}
	}

	return head;
}